

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

void __thiscall CT::PerformLabeling(CT *this)

{
  uint *puVar1;
  undefined8 uVar2;
  char cVar3;
  Mat1i *pMVar4;
  Mat1b *pMVar5;
  int r;
  uint i_label;
  int c;
  bool b_external;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar2;
  local_98.width = (int)((ulong)uVar2 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar8 = 0;
  do {
    if (*(int *)&pMVar5->field_0x8 <= lVar8) {
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar8 = 0; lVar8 < *(int *)&pMVar4->field_0x8; lVar8 = lVar8 + 1) {
        lVar6 = **(long **)&pMVar4->field_0x48 * lVar8 + *(long *)&pMVar4->field_0x10;
        for (lVar7 = 0; lVar7 < *(int *)&pMVar4->field_0xc; lVar7 = lVar7 + 1) {
          if (*(int *)(lVar6 + lVar7 * 4) == -1) {
            *(undefined4 *)(lVar6 + lVar7 * 4) = 0;
          }
        }
      }
      puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
      *puVar1 = *puVar1 + 1;
      return;
    }
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar6 = **(long **)&pMVar4->field_0x48 * lVar8 + *(long *)&pMVar4->field_0x10;
    lVar7 = **(long **)&pMVar5->field_0x48 * lVar8 + *(long *)&pMVar5->field_0x10;
    for (lVar9 = 0; lVar9 < *(int *)&pMVar5->field_0xc; lVar9 = lVar9 + 1) {
      cVar3 = *(char *)(lVar7 + lVar9);
      if (cVar3 == (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
        i_label = *(uint *)(lVar6 + lVar9 * 4);
        if ((i_label == 0) && ((lVar9 == 0 || (*(char *)(lVar7 + -1 + lVar9) != cVar3)))) {
          i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
          b_external = true;
        }
        else {
          if ((((long)*(int *)&pMVar5->field_0xc + -1 <= lVar9) ||
              (*(char *)(lVar7 + 1 + lVar9) == cVar3)) || (*(int *)(lVar6 + 4 + lVar9 * 4) == -1)) {
            if (i_label == 0) {
              *(undefined4 *)(lVar6 + lVar9 * 4) = *(undefined4 *)(lVar6 + -4 + lVar9 * 4);
            }
            goto LAB_0017e673;
          }
          if (i_label == 0) {
            i_label = *(uint *)(lVar6 + -4 + lVar9 * 4);
          }
          b_external = false;
        }
        ContourTracing(this,(int)lVar9,(int)lVar8,i_label,b_external);
      }
LAB_0017e673:
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }